

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string_view classname,
          NameEquality equality_mode)

{
  ushort *puVar1;
  bool bVar2;
  NameEquality NVar3;
  long lVar4;
  NameEquality equality_mode_00;
  long lVar5;
  string_view classname_00;
  string_view a;
  string_view a_00;
  
  equality_mode_00 = equality_mode;
  if (0 < file->enum_type_count_) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      puVar1 = *(ushort **)(&file->enum_types_->super_SymbolBase + lVar5);
      a._M_len = (ulong)*puVar1;
      a._M_str = (char *)(~a._M_len + (long)puVar1);
      NVar3 = java::anon_unknown_0::CheckNameEquality(a,classname);
      if (NVar3 == equality_mode) {
        return true;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x58;
    } while (lVar4 < file->enum_type_count_);
  }
  if (0 < file->service_count_) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      puVar1 = *(ushort **)(&file->services_->super_SymbolBase + lVar5);
      a_00._M_len = (ulong)*puVar1;
      a_00._M_str = (char *)(~a_00._M_len + (long)puVar1);
      NVar3 = java::anon_unknown_0::CheckNameEquality(a_00,classname);
      if (NVar3 == equality_mode) {
        return true;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x40;
    } while (lVar4 < file->service_count_);
  }
  if (file->message_type_count_ < 1) {
    bVar2 = false;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    do {
      classname_00._M_str._0_4_ = equality_mode;
      classname_00._M_len = (size_t)classname._M_str;
      classname_00._M_str._4_4_ = 0;
      bVar2 = java::anon_unknown_0::MessageHasConflictingClassName
                        ((anon_unknown_0 *)(&file->message_types_->super_SymbolBase + lVar5),
                         (Descriptor *)classname._M_len,classname_00,equality_mode_00);
      if (bVar2) {
        return bVar2;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xa0;
    } while (lVar4 < file->message_type_count_);
  }
  return bVar2;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(const FileDescriptor* file,
                                                absl::string_view classname,
                                                NameEquality equality_mode) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (CheckNameEquality(file->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (CheckNameEquality(file->service(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  return false;
}